

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O3

void __thiscall AbstractTaskProvider::_taskRun(AbstractTaskProvider *this,bool skip)

{
  atomic<unsigned_long> *paVar1;
  ulong uVar2;
  __int_type _Var3;
  int iVar4;
  
  LOCK();
  paVar1 = &this->_givenTaskCount;
  uVar2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  if (uVar2 < (this->_taskCount).super___atomic_base<unsigned_long>._M_i) {
    if (!skip) {
      (*this->_vptr_AbstractTaskProvider[2])(this);
    }
    LOCK();
    paVar1 = &this->_completedTaskCount;
    _Var3 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    if (_Var3 + 1 == (this->_taskCount).super___atomic_base<unsigned_long>._M_i) {
      iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->_completion);
      if (iVar4 == 0) {
        this->_running = false;
        std::condition_variable::notify_one();
        pthread_mutex_unlock((pthread_mutex_t *)&this->_completion);
        return;
      }
      std::__throw_system_error(iVar4);
    }
  }
  return;
}

Assistant:

void AbstractTaskProvider::_taskRun( bool skip )
{
    const size_t taskId = _givenTaskCount++;

    if( taskId < _taskCount ) {
        if( !skip ) {
            try {
                _task( taskId );
            }
            catch( ... ) {
                // here should be some logging code stating about an exception
                // or add your code to feedback about an exception
                _exceptionRaised = true;
            }
        }

        const size_t completedTasks = (++_completedTaskCount);

        if( completedTasks == _taskCount ) {
            _completion.lock();

            _running = false;
            _waiting.notify_one();

            _completion.unlock();
        }
    }
}